

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureValidLogonState_MsgTypeLogoutAndLogonAlreadySent_ValidHelper::
~initiatorFixtureValidLogonState_MsgTypeLogoutAndLogonAlreadySent_ValidHelper
          (initiatorFixtureValidLogonState_MsgTypeLogoutAndLogonAlreadySent_ValidHelper *this)

{
  ~initiatorFixtureValidLogonState_MsgTypeLogoutAndLogonAlreadySent_ValidHelper
            ((initiatorFixtureValidLogonState_MsgTypeLogoutAndLogonAlreadySent_ValidHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ValidLogonState_MsgTypeLogoutAndLogonAlreadySent_Valid)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX42::Logout logout = createLogout( "ISLD", "TW", 2 );
  object->next( logout, UtcTimeStamp() );

  CHECK_EQUAL(0, toReject);
}